

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 djb::ggx::d2_to_h2(vec2 *d,float_t zi,float_t z_i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3 vVar6;
  
  fVar2 = (*d).x;
  fVar4 = (*d).y;
  fVar5 = 1.0 - (fVar2 * fVar2 + fVar4 * fVar4);
  fVar1 = 0.0;
  if (0.0 <= fVar5) {
    fVar1 = fVar5;
  }
  fVar5 = 1.0;
  if (fVar1 <= 1.0) {
    fVar5 = fVar1;
  }
  fVar5 = SQRT(fVar5);
  fVar3 = fVar5 * zi + (fVar4 * 0.0 - fVar2 * z_i);
  fVar1 = 0.0;
  if (0.0 <= fVar3) {
    fVar1 = fVar3;
  }
  fVar3 = 1.0;
  if (fVar1 <= 1.0) {
    fVar3 = fVar1;
  }
  vVar6.y = fVar5 * 0.0 + fVar2 * 0.0 + fVar4;
  vVar6.x = z_i * fVar5 + fVar4 * 0.0 + fVar2 * zi;
  vVar6.z = fVar3;
  return vVar6;
}

Assistant:

vec3 ggx::d2_to_h2(const vec2 &d, float_t zi, float_t z_i)
{
	vec3 z = vec3(z_i, 0, zi);
	vec3 y = vec3(0, 1, 0);
	vec3 x = vec3(zi, 0, -z_i); // cross(z, y)
	float_t tmp = sat(1 - dot(d, d));
	vec3 wm = x * d.x + y * d.y + z * sqrt(tmp);

	return vec3(wm.x, wm.y, sat(wm.z));
}